

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

void check_string(string *s)

{
  byte *pbVar1;
  char cVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char *pcVar10;
  runtime_error *this;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  char cVar15;
  uint uVar16;
  char *pcVar17;
  char *pcVar18;
  ulong uVar19;
  byte bVar20;
  ulong uVar21;
  long lVar22;
  char *pcVar23;
  byte bVar24;
  char *ptr;
  char *pcVar25;
  bool bVar26;
  double x;
  double local_48;
  double local_40;
  double local_38;
  
  ptr = (s->_M_dataplus)._M_p;
  cVar2 = *ptr;
  pcVar10 = ptr;
  cVar15 = cVar2;
  if (cVar2 == '-') {
    cVar15 = ptr[1];
    if ((byte)(cVar15 - 0x30U) < 10) {
      pcVar10 = ptr + 1;
      goto LAB_00102bcc;
    }
  }
  else {
LAB_00102bcc:
    if (cVar15 == '0') {
      bVar24 = pcVar10[1];
      if (9 < (byte)(bVar24 - 0x30)) {
        pcVar18 = pcVar10 + 1;
        uVar21 = 0;
LAB_00102c28:
        if (bVar24 == 0x2e) {
          if (9 < (byte)(pcVar18[1] - 0x30U)) goto LAB_00102db8;
          uVar21 = (ulong)(byte)(pcVar18[1] - 0x30U) + uVar21 * 10;
          pcVar17 = pcVar18 + 2;
          bVar24 = pcVar18[2];
          while ((byte)(bVar24 - 0x30) < 10) {
            uVar21 = (ulong)(byte)(bVar24 - 0x30) + uVar21 * 10;
            pbVar1 = (byte *)(pcVar17 + 1);
            pcVar17 = pcVar17 + 1;
            bVar24 = *pbVar1;
          }
          pcVar25 = pcVar18 + (1 - (long)pcVar17);
          pcVar18 = pcVar17;
        }
        else {
          pcVar25 = (char *)0x0;
        }
        if ((bVar24 | 0x20) == 0x65) {
          bVar26 = (pcVar18[1] - 0x2bU & 0xfd) == 0;
          pcVar17 = pcVar18 + 1;
          if (bVar26) {
            pcVar17 = pcVar18 + 2;
          }
          bVar24 = pcVar18[(ulong)bVar26 + 1] - 0x30;
          if (9 < bVar24) goto LAB_00102db8;
          bVar20 = pcVar17[1] - 0x30;
          uVar13 = (ulong)bVar20 + (ulong)bVar24 * 10;
          if (9 < bVar20) {
            uVar13 = (ulong)bVar24;
          }
          pcVar23 = pcVar17 + 2;
          if (9 < bVar20) {
            pcVar23 = pcVar17 + 1;
          }
          bVar26 = (byte)(pcVar17[(ulong)(bVar20 < 10) + 1] - 0x30U) < 10;
          uVar12 = (ulong)(byte)(pcVar17[(ulong)(bVar20 < 10) + 1] - 0x30U) + uVar13 * 10;
          if (!bVar26) {
            uVar12 = uVar13;
          }
          bVar24 = pcVar23[bVar26] - 0x30;
          if (bVar24 < 10) {
            pcVar23 = pcVar23 + bVar26;
            do {
              pcVar23 = pcVar23 + 1;
              if ((long)uVar12 < 0x100000000) {
                uVar12 = (ulong)bVar24 + uVar12 * 10;
              }
              bVar24 = *pcVar23 - 0x30;
            } while (bVar24 < 10);
          }
          uVar13 = -uVar12;
          if (pcVar18[1] != '-') {
            uVar13 = uVar12;
          }
          pcVar25 = pcVar25 + uVar13;
        }
        if ((int)(~(uint)pcVar10 + (int)pcVar18) < 0x13) {
LAB_00102d92:
          if (pcVar25 + -0x135 < (char *)0xfffffffffffffd86) goto LAB_00102da1;
          if ((uVar21 >> 0x35 == 0) && (pcVar25 + 0x16 < (char *)0x2d)) {
            if ((long)pcVar25 < 0) {
              local_48 = (double)(long)uVar21 /
                         *(double *)
                          (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                           power_of_ten + (long)pcVar25 * -8);
            }
            else {
              local_48 = (double)(long)uVar21 *
                         *(double *)
                          (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                           power_of_ten + (long)pcVar25 * 8);
            }
            if (cVar2 == '-') {
              local_48 = -local_48;
            }
          }
          else {
            if (uVar21 != 0) {
              uVar13 = 0x3f;
              if (uVar21 != 0) {
                for (; uVar21 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              uVar21 = uVar21 << ((byte)(uVar13 ^ 0x3f) & 0x3f);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = uVar21;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)(fast_double_parser::
                                        compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64
                                       + (long)pcVar25 * 8 + 0xa28);
              auVar3 = auVar3 * auVar5;
              uVar11 = auVar3._0_8_;
              uVar12 = auVar3._8_8_ & 0x1ff;
              if ((uVar12 == 0x1ff) && (uVar12 = 0x1ff, CARRY8(uVar11,uVar21))) {
                auVar4._8_8_ = 0;
                auVar4._0_8_ = uVar21;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = *(ulong *)(fast_double_parser::
                                          compute_float_64(long,unsigned_long,bool,bool*)::
                                          mantissa_128 + (long)pcVar25 * 8 + 0xa28);
                uVar19 = SUB168(auVar4 * auVar6,8);
                auVar9._8_8_ = 0;
                auVar9._0_8_ = uVar19;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = uVar19;
                auVar8._8_8_ = 0;
                auVar8._0_8_ = uVar19;
                auVar8 = auVar3 + auVar8;
                auVar7 = auVar3 + auVar7;
                uVar16 = auVar3._8_4_ + (uint)CARRY8(uVar11,uVar19) & 0x1ff;
                uVar12 = (ulong)uVar16;
                auVar3 = auVar3 + auVar9;
                if ((!CARRY8(SUB168(auVar4 * auVar6,0),uVar21)) ||
                   ((auVar3 = auVar7, uVar11 + uVar19 != -1 || (auVar3 = auVar8, uVar16 != 0x1ff))))
                goto LAB_00102e63;
              }
              else {
LAB_00102e63:
                uVar21 = auVar3._8_8_ >> (9U - (auVar3[0xf] >> 7) & 0x3f);
                uVar16 = (uint)uVar21;
                if ((auVar3._0_8_ != 0) || ((uVar12 != 0 || ((uVar16 & 3) != 1)))) {
                  uVar21 = (uVar16 & 1) + uVar21;
                  uVar12 = uVar21 >> 0x36;
                  uVar13 = (((long)pcVar25 * 0x3526a >> 0x10) + 0x43f) -
                           ((auVar3._8_8_ >> 0x3f ^ 1) + (uVar13 ^ 0x3f) + -1 + (ulong)(uVar12 == 0)
                           );
                  if ((uVar13 != 0) && (uVar13 < 0x7ff)) {
                    uVar11 = 0;
                    if (uVar12 == 0) {
                      uVar11 = uVar21 >> 1 & 0xefffffffffffff;
                    }
                    local_48 = (double)((ulong)(cVar2 == '-') << 0x3f | uVar11 | uVar13 << 0x34);
                    goto LAB_00102f41;
                  }
                }
              }
              local_48 = 0.0;
              goto LAB_00102da1;
            }
            if (cVar2 == '-') {
              local_48 = -0.0;
            }
            else {
              local_48 = 0.0;
            }
          }
        }
        else {
          lVar22 = 1;
          while ((cVar15 == '0' || (cVar15 == '.'))) {
            pcVar17 = pcVar10 + lVar22;
            lVar22 = lVar22 + 1;
            cVar15 = *pcVar17;
          }
          if ((int)(((int)pcVar18 - (uint)pcVar10) - (int)lVar22) < 0x13) goto LAB_00102d92;
LAB_00102da1:
          pcVar10 = fast_double_parser::parse_float_strtod(ptr,&local_48);
          if (pcVar10 == (char *)0x0) {
            ptr = (s->_M_dataplus)._M_p;
            goto LAB_00102db8;
          }
        }
LAB_00102f41:
        if (check_string(std::__cxx11::string)::c_locale == '\0') {
          check_string();
        }
        local_38 = strtod_l((s->_M_dataplus)._M_p,(char **)0x0,(__locale_t)check_string::c_locale);
        if ((local_38 == local_48) && (!NAN(local_38) && !NAN(local_48))) {
          return;
        }
        local_40 = local_48;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"fast_double_parser disagrees",0x1c);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        printf("fast_double_parser: %.*e\n",local_40,0x10);
        printf("reference: %.*e\n",local_38,0x10);
        printf("string: %s\n",(s->_M_dataplus)._M_p);
        if ((long)((ulong)local_40 ^ (ulong)local_38) < 0) {
          lVar22 = (long)local_38 + (long)local_40 + 0x80000000;
        }
        else {
          lVar14 = (long)local_40 - (long)local_38;
          lVar22 = -lVar14;
          if (0 < lVar14) {
            lVar22 = lVar14;
          }
        }
        printf("f64_ulp_dist = %d\n",lVar22);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"fast_double_parser disagrees");
        goto LAB_001030ea;
      }
    }
    else if ((byte)(cVar15 - 0x30U) < 10) {
      uVar21 = (ulong)(byte)(cVar15 - 0x30U);
      bVar24 = pcVar10[1];
      pcVar25 = pcVar10;
      while( true ) {
        pcVar18 = pcVar25 + 1;
        if (9 < (byte)(bVar24 - 0x30)) break;
        uVar21 = (ulong)(byte)(bVar24 - 0x30) + uVar21 * 10;
        bVar24 = pcVar25[2];
        pcVar25 = pcVar18;
      }
      goto LAB_00102c28;
    }
  }
LAB_00102db8:
  printf("fast_double_parser refused to parse %s\n",ptr);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"fast_double_parser refused to parse");
LAB_001030ea:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_string(std::string s) {
  double x;
  bool isok = fast_double_parser::parse_number(s.data(), &x);
  if (!isok) {
    printf("fast_double_parser refused to parse %s\n", s.c_str());
    throw std::runtime_error("fast_double_parser refused to parse");
  }
#if defined(FAST_DOUBLE_PARSER_SOLARIS) || defined(FAST_DOUBLE_PARSER_CYGWIN) 
  // workround for cygwin, solaris
  char *endptr;
  double d = cygwin_strtod_l(s.data(), &endptr);
#elif defined(_WIN32)
  static _locale_t c_locale = _create_locale(LC_ALL, "C");
  double d = _strtod_l(s.data(), nullptr, c_locale);
#else
  static locale_t c_locale = newlocale(LC_ALL_MASK, "C", NULL);
  double d = strtod_l(s.data(), nullptr, c_locale);
#endif
  if (d != x) {
    std::cerr << "fast_double_parser disagrees" << std::endl;
    printf("fast_double_parser: %.*e\n", DBL_DIG + 1, x);
    printf("reference: %.*e\n", DBL_DIG + 1, d);
    printf("string: %s\n", s.c_str());
    printf("f64_ulp_dist = %d\n", (int)f64_ulp_dist(x, d));
    throw std::runtime_error("fast_double_parser disagrees");
  }
}